

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

bool __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
::hasFastAccess(FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
                *this)

{
  if ((((((this->left_->fadexpr_).left_)->dx_).num_elts != 0) &&
      ((((this->left_->fadexpr_).right_)->dx_).num_elts != 0)) &&
     ((((this->right_->fadexpr_).expr_.fadexpr_.left_)->dx_).num_elts != 0)) {
    return (((this->right_->fadexpr_).expr_.fadexpr_.right_)->dx_).num_elts != 0;
  }
  return false;
}

Assistant:

bool hasFastAccess() const { return left_.hasFastAccess() && right_.hasFastAccess();}